

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

string * __thiscall
diligent_spirv_cross::CompilerGLSL::to_expression_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,uint32_t id,
          bool register_expression_read)

{
  bool bVar1;
  Types TVar2;
  uint32_t uVar3;
  Variant *pVVar4;
  SPIRType *pSVar5;
  size_type sVar6;
  string *basename;
  SPIRExpression *pSVar7;
  mapped_type *pmVar8;
  CompilerError *pCVar9;
  char **ts_1;
  Decoration *dec;
  uint32_t local_144;
  SPIRVariable *pSStack_140;
  uint32_t undef_id;
  SPIRVariable *var;
  char *local_118;
  diligent_spirv_cross local_110 [35];
  undefined1 local_ed;
  int local_ec;
  uint32_t local_e8;
  int wg_index;
  SPIRType *local_e0;
  SPIRType *type;
  SPIRConstant *c;
  string local_c8 [32];
  ID local_a8;
  byte local_a2;
  byte local_a1;
  uint32_t local_a0;
  bool relaxed;
  bool is_packed;
  uint32_t physical_type_id;
  string local_90;
  SPIRExpression *local_70;
  SPIRExpression *e;
  _Node_iterator_base<unsigned_int,_false> local_60;
  uint32_t local_54;
  TypedID<(diligent_spirv_cross::Types)0> *pTStack_50;
  uint32_t dep;
  TypedID<(diligent_spirv_cross::Types)0> *__end2;
  TypedID<(diligent_spirv_cross::Types)0> *__begin2;
  SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL> *__range2;
  SPIRExpression *expr;
  _Node_iterator_base<unsigned_int,_false> local_28;
  iterator itr;
  bool register_expression_read_local;
  uint32_t id_local;
  CompilerGLSL *this_local;
  string *wg_size;
  
  itr.super__Node_iterator_base<unsigned_int,_false>._M_cur._3_1_ = register_expression_read;
  itr.super__Node_iterator_base<unsigned_int,_false>._M_cur._4_4_ = id;
  local_28._M_cur =
       (__node_type *)
       ::std::
       unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
       ::find(&(this->super_Compiler).invalid_expressions,
              (key_type *)((long)&itr.super__Node_iterator_base<unsigned_int,_false>._M_cur + 4));
  expr = (SPIRExpression *)
         ::std::
         end<std::unordered_set<unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<unsigned_int>>>
                   (&(this->super_Compiler).invalid_expressions);
  bVar1 = ::std::__detail::operator!=(&local_28,(_Node_iterator_base<unsigned_int,_false> *)&expr);
  if (bVar1) {
    handle_invalid_expression(this,itr.super__Node_iterator_base<unsigned_int,_false>._M_cur._4_4_);
  }
  pVVar4 = VectorView<diligent_spirv_cross::Variant>::operator[]
                     (&(this->super_Compiler).ir.ids.super_VectorView<diligent_spirv_cross::Variant>
                      ,(ulong)itr.super__Node_iterator_base<unsigned_int,_false>._M_cur._4_4_);
  TVar2 = Variant::get_type(pVVar4);
  if (TVar2 == TypeExpression) {
    __range2 = (SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL> *)
               Compiler::get<diligent_spirv_cross::SPIRExpression>
                         (&this->super_Compiler,
                          itr.super__Node_iterator_base<unsigned_int,_false>._M_cur._4_4_);
    __begin2 = (TypedID<(diligent_spirv_cross::Types)0> *)
               &((SPIRExpression *)__range2)->expression_dependencies;
    __end2 = VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>::begin
                       ((VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>
                         *)__begin2);
    pTStack_50 = VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>::end
                           ((VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>
                             *)__begin2);
    for (; __end2 != pTStack_50; __end2 = __end2 + 1) {
      local_54 = TypedID::operator_cast_to_unsigned_int((TypedID *)__end2);
      local_60._M_cur =
           (__node_type *)
           ::std::
           unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
           ::find(&(this->super_Compiler).invalid_expressions,&local_54);
      e = (SPIRExpression *)
          ::std::
          end<std::unordered_set<unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<unsigned_int>>>
                    (&(this->super_Compiler).invalid_expressions);
      bVar1 = ::std::__detail::operator!=(&local_60,(_Node_iterator_base<unsigned_int,_false> *)&e);
      if (bVar1) {
        handle_invalid_expression(this,local_54);
      }
    }
  }
  if ((itr.super__Node_iterator_base<unsigned_int,_false>._M_cur._3_1_ & 1) != 0) {
    track_expression_read(this,itr.super__Node_iterator_base<unsigned_int,_false>._M_cur._4_4_);
  }
  pVVar4 = VectorView<diligent_spirv_cross::Variant>::operator[]
                     (&(this->super_Compiler).ir.ids.super_VectorView<diligent_spirv_cross::Variant>
                      ,(ulong)itr.super__Node_iterator_base<unsigned_int,_false>._M_cur._4_4_);
  TVar2 = Variant::get_type(pVVar4);
  switch(TVar2) {
  case TypeVariable:
    pSStack_140 = Compiler::get<diligent_spirv_cross::SPIRVariable>
                            (&this->super_Compiler,
                             itr.super__Node_iterator_base<unsigned_int,_false>._M_cur._4_4_);
    if (((pSStack_140->statically_assigned & 1U) == 0) &&
       (((pSStack_140->loop_variable & 1U) == 0 || ((pSStack_140->loop_variable_enable & 1U) != 0)))
       ) {
      if ((pSStack_140->deferred_declaration & 1U) == 0) {
        sVar6 = ::std::
                unordered_map<unsigned_int,_bool,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bool>_>_>
                ::count(&this->flattened_structs,
                        (key_type *)
                        ((long)&itr.super__Node_iterator_base<unsigned_int,_false>._M_cur + 4));
        if (sVar6 == 0) {
          pmVar8 = ::std::
                   unordered_map<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_diligent_spirv_cross::Meta,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>,_std::allocator<std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_diligent_spirv_cross::Meta>_>_>
                   ::operator[](&(this->super_Compiler).ir.meta,&(pSStack_140->super_IVariant).self)
          ;
          if (((pmVar8->decoration).builtin & 1U) == 0) {
            (*(this->super_Compiler)._vptr_Compiler[6])
                      (__return_storage_ptr__,this,
                       (ulong)itr.super__Node_iterator_base<unsigned_int,_false>._M_cur._4_4_,1);
          }
          else {
            (*(this->super_Compiler)._vptr_Compiler[0x14])
                      (__return_storage_ptr__,this,(ulong)(pmVar8->decoration).builtin_type,
                       (ulong)pSStack_140->storage);
          }
        }
        else {
          (*(this->super_Compiler)._vptr_Compiler[6])
                    (&dec,this,
                     (ulong)itr.super__Node_iterator_base<unsigned_int,_false>._M_cur._4_4_,1);
          uVar3 = TypedID::operator_cast_to_unsigned_int
                            ((TypedID *)&(pSStack_140->super_IVariant).field_0xc);
          pSVar5 = Compiler::get<diligent_spirv_cross::SPIRType>(&this->super_Compiler,uVar3);
          load_flattened_struct(__return_storage_ptr__,this,(string *)&dec,pSVar5);
          ::std::__cxx11::string::~string((string *)&dec);
        }
      }
      else {
        pSStack_140->deferred_declaration = false;
        (*(this->super_Compiler)._vptr_Compiler[0x28])(__return_storage_ptr__,this,pSStack_140);
      }
    }
    else {
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSStack_140->static_expression);
      if (uVar3 == 0) {
        uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSStack_140->initializer);
        if (uVar3 == 0) {
          local_144 = ParsedIR::increase_bound_by(&(this->super_Compiler).ir,1);
          uVar3 = Compiler::get_variable_data_type_id(&this->super_Compiler,pSStack_140);
          pSVar7 = emit_uninitialized_temporary_expression(this,uVar3,local_144);
          ::std::__cxx11::string::string
                    ((string *)__return_storage_ptr__,(string *)&pSVar7->expression);
        }
        else {
          uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSStack_140->initializer);
          to_expression_abi_cxx11_(__return_storage_ptr__,this,uVar3,true);
        }
      }
      else {
        uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSStack_140->static_expression);
        to_expression_abi_cxx11_(__return_storage_ptr__,this,uVar3,true);
      }
    }
    break;
  case TypeConstant:
    type = (SPIRType *)
           Compiler::get<diligent_spirv_cross::SPIRConstant>
                     (&this->super_Compiler,
                      itr.super__Node_iterator_base<unsigned_int,_false>._M_cur._4_4_);
    uVar3 = TypedID::operator_cast_to_unsigned_int
                      ((TypedID *)&(((SPIRConstant *)type)->super_IVariant).field_0xc);
    local_e0 = Compiler::get<diligent_spirv_cross::SPIRType>(&this->super_Compiler,uVar3);
    wg_index = (type->super_IVariant).self.id;
    bVar1 = Compiler::has_decoration(&this->super_Compiler,(ID)wg_index,BuiltIn);
    if (bVar1) {
      local_e8 = (type->super_IVariant).self.id;
      uVar3 = Compiler::get_decoration(&this->super_Compiler,(ID)local_e8,BuiltIn);
      (*(this->super_Compiler)._vptr_Compiler[0x14])(__return_storage_ptr__,this,(ulong)uVar3,8);
    }
    else if (((type->image).format & ImageFormatRgba32f) == ImageFormatUnknown) {
      if (((type->image).format & 0x10000) == ImageFormatUnknown) {
        if ((local_e0->basetype == Struct) &&
           (((this->backend).can_declare_struct_inline & 1U) == 0)) {
          (*(this->super_Compiler)._vptr_Compiler[6])
                    (__return_storage_ptr__,this,
                     (ulong)itr.super__Node_iterator_base<unsigned_int,_false>._M_cur._4_4_,1);
        }
        else {
          bVar1 = VectorView<unsigned_int>::empty(&(local_e0->array).super_VectorView<unsigned_int>)
          ;
          if ((bVar1) || (((this->backend).can_declare_arrays_inline & 1U) != 0)) {
            constant_expression_abi_cxx11_
                      (__return_storage_ptr__,this,(SPIRConstant *)type,false,false);
          }
          else {
            (*(this->super_Compiler)._vptr_Compiler[6])
                      (__return_storage_ptr__,this,
                       (ulong)itr.super__Node_iterator_base<unsigned_int,_false>._M_cur._4_4_,1);
          }
        }
      }
      else {
        (*(this->super_Compiler)._vptr_Compiler[6])
                  (__return_storage_ptr__,this,
                   (ulong)itr.super__Node_iterator_base<unsigned_int,_false>._M_cur._4_4_,1);
      }
    }
    else if ((((this->backend).workgroup_size_is_hidden & 1U) == 0) ||
            (local_ec = get_constant_mapping_to_workgroup_component(this,(SPIRConstant *)type),
            local_ec < 0)) {
      bVar1 = expression_is_forwarded
                        (this,itr.super__Node_iterator_base<unsigned_int,_false>._M_cur._4_4_);
      if (bVar1) {
        constant_expression_abi_cxx11_(__return_storage_ptr__,this,(SPIRConstant *)type,false,false)
        ;
      }
      else {
        (*(this->super_Compiler)._vptr_Compiler[6])
                  (__return_storage_ptr__,this,
                   (ulong)itr.super__Node_iterator_base<unsigned_int,_false>._M_cur._4_4_,1);
      }
    }
    else {
      local_ed = 0;
      ts_1 = (char **)0x1;
      (*(this->super_Compiler)._vptr_Compiler[0x14])(local_110,this,0x19);
      local_118 = vector_swizzle(1,local_ec);
      join<std::__cxx11::string,char_const*>
                (__return_storage_ptr__,local_110,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_118,
                 ts_1);
      ::std::__cxx11::string::~string((string *)local_110);
      if (local_e0->basetype != UInt) {
        bitcast_expression((string *)&var,this,local_e0,UInt,__return_storage_ptr__);
        ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&var);
        ::std::__cxx11::string::~string((string *)&var);
      }
    }
    break;
  default:
    (*(this->super_Compiler)._vptr_Compiler[6])
              (__return_storage_ptr__,this,
               (ulong)itr.super__Node_iterator_base<unsigned_int,_false>._M_cur._4_4_,1);
    break;
  case TypeExpression:
    local_70 = Compiler::get<diligent_spirv_cross::SPIRExpression>
                         (&this->super_Compiler,
                          itr.super__Node_iterator_base<unsigned_int,_false>._M_cur._4_4_);
    uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(local_70->super_IVariant).field_0xc)
    ;
    if (uVar3 == 0) {
      if ((local_70->need_transpose & 1U) == 0) {
        sVar6 = ::std::
                unordered_map<unsigned_int,_bool,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bool>_>_>
                ::count(&this->flattened_structs,
                        (key_type *)
                        ((long)&itr.super__Node_iterator_base<unsigned_int,_false>._M_cur + 4));
        if (sVar6 == 0) {
          bVar1 = Compiler::is_forcing_recompilation(&this->super_Compiler);
          if (bVar1) {
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      ((string *)__return_storage_ptr__,"_",(allocator *)((long)&c + 7));
            ::std::allocator<char>::~allocator((allocator<char> *)((long)&c + 7));
          }
          else {
            ::std::__cxx11::string::string
                      ((string *)__return_storage_ptr__,(string *)&local_70->expression);
          }
        }
        else {
          basename = &local_70->expression;
          uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_70->expression_type);
          pSVar5 = Compiler::get<diligent_spirv_cross::SPIRType>(&this->super_Compiler,uVar3);
          load_flattened_struct(__return_storage_ptr__,this,basename,pSVar5);
        }
      }
      else {
        local_a0 = Compiler::get_extended_decoration
                             (&this->super_Compiler,
                              itr.super__Node_iterator_base<unsigned_int,_false>._M_cur._4_4_,
                              SPIRVCrossDecorationPhysicalTypeID);
        local_a1 = Compiler::has_extended_decoration
                             (&this->super_Compiler,
                              itr.super__Node_iterator_base<unsigned_int,_false>._M_cur._4_4_,
                              SPIRVCrossDecorationPhysicalTypePacked);
        TypedID<(diligent_spirv_cross::Types)0>::TypedID
                  (&local_a8,itr.super__Node_iterator_base<unsigned_int,_false>._M_cur._4_4_);
        local_a2 = Compiler::has_decoration
                             (&this->super_Compiler,local_a8,DecorationRelaxedPrecision);
        ::std::__cxx11::string::string(local_c8,(string *)&local_70->expression);
        uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_70->expression_type);
        pSVar5 = Compiler::get<diligent_spirv_cross::SPIRType>(&this->super_Compiler,uVar3);
        (*(this->super_Compiler)._vptr_Compiler[0x2b])
                  (__return_storage_ptr__,this,local_c8,pSVar5,(ulong)local_a0,(ulong)(local_a1 & 1)
                   ,local_a2 & 1);
        ::std::__cxx11::string::~string(local_c8);
      }
    }
    else {
      uVar3 = TypedID::operator_cast_to_unsigned_int
                        ((TypedID *)&(local_70->super_IVariant).field_0xc);
      to_enclosed_expression_abi_cxx11_(&local_90,this,uVar3,true);
      ::std::operator+(__return_storage_ptr__,&local_90,&local_70->expression);
      ::std::__cxx11::string::~string((string *)&local_90);
    }
    break;
  case TypeConstantOp:
    (*(this->super_Compiler)._vptr_Compiler[6])
              (__return_storage_ptr__,this,
               (ulong)itr.super__Node_iterator_base<unsigned_int,_false>._M_cur._4_4_,1);
    break;
  case TypeCombinedImageSampler:
    pCVar9 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError
              (pCVar9,"Combined image samplers have no default expression representation.");
    __cxa_throw(pCVar9,&CompilerError::typeinfo,CompilerError::~CompilerError);
  case TypeAccessChain:
    pCVar9 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(pCVar9,"Access chains have no default expression representation.");
    __cxa_throw(pCVar9,&CompilerError::typeinfo,CompilerError::~CompilerError);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::to_expression(uint32_t id, bool register_expression_read)
{
	auto itr = invalid_expressions.find(id);
	if (itr != end(invalid_expressions))
		handle_invalid_expression(id);

	if (ir.ids[id].get_type() == TypeExpression)
	{
		// We might have a more complex chain of dependencies.
		// A possible scenario is that we
		//
		// %1 = OpLoad
		// %2 = OpDoSomething %1 %1. here %2 will have a dependency on %1.
		// %3 = OpDoSomethingAgain %2 %2. Here %3 will lose the link to %1 since we don't propagate the dependencies like that.
		// OpStore %1 %foo // Here we can invalidate %1, and hence all expressions which depend on %1. Only %2 will know since it's part of invalid_expressions.
		// %4 = OpDoSomethingAnotherTime %3 %3 // If we forward all expressions we will see %1 expression after store, not before.
		//
		// However, we can propagate up a list of depended expressions when we used %2, so we can check if %2 is invalid when reading %3 after the store,
		// and see that we should not forward reads of the original variable.
		auto &expr = get<SPIRExpression>(id);
		for (uint32_t dep : expr.expression_dependencies)
			if (invalid_expressions.find(dep) != end(invalid_expressions))
				handle_invalid_expression(dep);
	}

	if (register_expression_read)
		track_expression_read(id);

	switch (ir.ids[id].get_type())
	{
	case TypeExpression:
	{
		auto &e = get<SPIRExpression>(id);
		if (e.base_expression)
			return to_enclosed_expression(e.base_expression) + e.expression;
		else if (e.need_transpose)
		{
			// This should not be reached for access chains, since we always deal explicitly with transpose state
			// when consuming an access chain expression.
			uint32_t physical_type_id = get_extended_decoration(id, SPIRVCrossDecorationPhysicalTypeID);
			bool is_packed = has_extended_decoration(id, SPIRVCrossDecorationPhysicalTypePacked);
			bool relaxed = has_decoration(id, DecorationRelaxedPrecision);
			return convert_row_major_matrix(e.expression, get<SPIRType>(e.expression_type), physical_type_id,
			                                is_packed, relaxed);
		}
		else if (flattened_structs.count(id))
		{
			return load_flattened_struct(e.expression, get<SPIRType>(e.expression_type));
		}
		else
		{
			if (is_forcing_recompilation())
			{
				// During first compilation phase, certain expression patterns can trigger exponential growth of memory.
				// Avoid this by returning dummy expressions during this phase.
				// Do not use empty expressions here, because those are sentinels for other cases.
				return "_";
			}
			else
				return e.expression;
		}
	}

	case TypeConstant:
	{
		auto &c = get<SPIRConstant>(id);
		auto &type = get<SPIRType>(c.constant_type);

		// WorkGroupSize may be a constant.
		if (has_decoration(c.self, DecorationBuiltIn))
			return builtin_to_glsl(BuiltIn(get_decoration(c.self, DecorationBuiltIn)), StorageClassGeneric);
		else if (c.specialization)
		{
			if (backend.workgroup_size_is_hidden)
			{
				int wg_index = get_constant_mapping_to_workgroup_component(c);
				if (wg_index >= 0)
				{
					auto wg_size = join(builtin_to_glsl(BuiltInWorkgroupSize, StorageClassInput), vector_swizzle(1, wg_index));
					if (type.basetype != SPIRType::UInt)
						wg_size = bitcast_expression(type, SPIRType::UInt, wg_size);
					return wg_size;
				}
			}

			if (expression_is_forwarded(id))
				return constant_expression(c);

			return to_name(id);
		}
		else if (c.is_used_as_lut)
			return to_name(id);
		else if (type.basetype == SPIRType::Struct && !backend.can_declare_struct_inline)
			return to_name(id);
		else if (!type.array.empty() && !backend.can_declare_arrays_inline)
			return to_name(id);
		else
			return constant_expression(c);
	}

	case TypeConstantOp:
		return to_name(id);

	case TypeVariable:
	{
		auto &var = get<SPIRVariable>(id);
		// If we try to use a loop variable before the loop header, we have to redirect it to the static expression,
		// the variable has not been declared yet.
		if (var.statically_assigned || (var.loop_variable && !var.loop_variable_enable))
		{
			// We might try to load from a loop variable before it has been initialized.
			// Prefer static expression and fallback to initializer.
			if (var.static_expression)
				return to_expression(var.static_expression);
			else if (var.initializer)
				return to_expression(var.initializer);
			else
			{
				// We cannot declare the variable yet, so have to fake it.
				uint32_t undef_id = ir.increase_bound_by(1);
				return emit_uninitialized_temporary_expression(get_variable_data_type_id(var), undef_id).expression;
			}
		}
		else if (var.deferred_declaration)
		{
			var.deferred_declaration = false;
			return variable_decl(var);
		}
		else if (flattened_structs.count(id))
		{
			return load_flattened_struct(to_name(id), get<SPIRType>(var.basetype));
		}
		else
		{
			auto &dec = ir.meta[var.self].decoration;
			if (dec.builtin)
				return builtin_to_glsl(dec.builtin_type, var.storage);
			else
				return to_name(id);
		}
	}

	case TypeCombinedImageSampler:
		// This type should never be taken the expression of directly.
		// The intention is that texture sampling functions will extract the image and samplers
		// separately and take their expressions as needed.
		// GLSL does not use this type because OpSampledImage immediately creates a combined image sampler
		// expression ala sampler2D(texture, sampler).
		SPIRV_CROSS_THROW("Combined image samplers have no default expression representation.");

	case TypeAccessChain:
		// We cannot express this type. They only have meaning in other OpAccessChains, OpStore or OpLoad.
		SPIRV_CROSS_THROW("Access chains have no default expression representation.");

	default:
		return to_name(id);
	}
}